

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool despot::option::Parser::streq(char *st1,char *st2)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    pcVar1 = st1 + lVar3;
    if (*pcVar1 == '\0') {
      return st2[lVar3] == '=' || st2[lVar3] == '\0';
    }
    pcVar2 = st2 + lVar3;
    lVar3 = lVar3 + 1;
  } while (*pcVar1 == *pcVar2);
  return false;
}

Assistant:

static bool streq(const char* st1, const char* st2) {
		while (*st1 != 0)
			if (*st1++ != *st2++)
				return false;
		return (*st2 == 0 || *st2 == '=');
	}